

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf_rule
          (CycleBreaking<covenant::Sym> *this,CFG *g,int lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rule,
          unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
          *new_non_terminals,set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  emplace_return eVar4;
  int curr_nt;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> terminal_symbols;
  Rule new_r;
  Rule new_rr;
  int local_dc;
  int local_d8;
  int local_d4;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  *local_d0;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_c8;
  Rule local_b0;
  CycleBreaking<covenant::Sym> *local_88;
  set<int,_std::less<int>,_std::allocator<int>_> *local_80;
  element_type *local_78;
  shared_count local_70;
  Rule local_68;
  element_type *local_40;
  shared_count local_38;
  
  local_dc = 0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = lhs;
  local_d0 = &new_non_terminals->table_;
  local_88 = this;
  local_80 = group_set;
  bVar1 = findNextNonTerminal(this,rule,group_set,
                              (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_c8,
                              &local_dc);
  local_b0._tfac.px = (g->_tfac).px;
  local_38.pi_ = (g->_tfac).pn.pi_;
  if (local_38.pi_ == (sp_counted_base *)0x0) {
    local_b0._tfac.pn.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
    UNLOCK();
    local_b0._tfac.pn.pi_ = local_38.pi_;
    if (local_38.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
      UNLOCK();
    }
  }
  local_b0._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = local_b0._tfac.px;
  boost::detail::shared_count::~shared_count(&local_38);
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)local_c8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8._M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)uVar3)
    break;
    Rule::operator<<(&local_b0,(Sym)local_c8._M_impl.super__Vector_impl_data._M_start[uVar3].x);
    uVar3 = uVar3 + 1;
  }
  if (bVar1) {
    eVar4 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                        *)local_d0,&local_d8);
    Rule::operator<<(&local_b0,
                     (Sym)*(int *)((long)&((eVar4.first.node_.node_)->value_base_).data_.data_ + 4))
    ;
    CFG::prod(g,(Sym)(local_d8 * 2 + 1),&local_b0);
  }
  else {
    Rule::operator<<(&local_b0,
                     (Sym)(rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                          _M_impl.super__Vector_impl_data._M_start[local_dc].x);
    CFG::prod(g,(Sym)(local_d8 * 2 + 1),&local_b0);
    iVar2 = local_dc;
    local_dc = local_dc + 1;
    do {
      if (local_c8._M_impl.super__Vector_impl_data._M_finish !=
          local_c8._M_impl.super__Vector_impl_data._M_start) {
        local_c8._M_impl.super__Vector_impl_data._M_finish =
             local_c8._M_impl.super__Vector_impl_data._M_start;
      }
      bVar1 = findNextNonTerminal(local_88,rule,local_80,
                                  (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_c8
                                  ,&local_dc);
      local_78 = (g->_tfac).px;
      local_70.pi_ = (g->_tfac).pn.pi_;
      if (local_70.pi_ == (sp_counted_base *)0x0) {
        local_68._tfac.pn.pi_ = (sp_counted_base *)0x0;
      }
      else {
        LOCK();
        (local_70.pi_)->use_count_ = (local_70.pi_)->use_count_ + 1;
        UNLOCK();
        local_68._tfac.pn.pi_ = local_70.pi_;
        if (local_70.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_70.pi_)->use_count_ = (local_70.pi_)->use_count_ + 1;
          UNLOCK();
        }
      }
      local_68._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68._tfac.px = local_78;
      boost::detail::shared_count::~shared_count(&local_70);
      uVar3 = 0;
      while( true ) {
        if ((ulong)((long)local_c8._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8._M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)uVar3)
        break;
        Rule::operator<<(&local_68,(Sym)local_c8._M_impl.super__Vector_impl_data._M_start[uVar3].x);
        uVar3 = uVar3 + 1;
      }
      if (bVar1) {
        eVar4 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                ::try_emplace_unique<int_const&>
                          ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                            *)local_d0,&local_d8);
        Rule::operator<<(&local_68,
                         (Sym)*(int *)((long)&((eVar4.first.node_.node_)->value_base_).data_.data_ +
                                      4));
        local_d4 = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl
                   .super__Vector_impl_data._M_start[iVar2].x >> 1;
        eVar4 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
                ::try_emplace_unique<int>(local_d0,&local_d4);
        CFG::prod(g,(Sym)*(int *)((long)&((eVar4.first.node_.node_)->value_base_).data_.data_ + 4),
                  &local_68);
      }
      else {
        Rule::operator<<(&local_68,
                         (Sym)(rule->
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                              _M_impl.super__Vector_impl_data._M_start[local_dc].x);
        local_d4 = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl
                   .super__Vector_impl_data._M_start[iVar2].x >> 1;
        eVar4 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
                ::try_emplace_unique<int>(local_d0,&local_d4);
        CFG::prod(g,(Sym)*(int *)((long)&((eVar4.first.node_.node_)->value_base_).data_.data_ + 4),
                  &local_68);
        iVar2 = local_dc;
        local_dc = local_dc + 1;
      }
      Rule::~Rule(&local_68);
    } while (!bVar1);
  }
  Rule::~Rule(&local_b0);
  std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_c8);
  return;
}

Assistant:

void cycle_breaking_transf_rule (CFG &g, 
                                   const int lhs, 
                                   const vector<EdgeSym> rule, 
                                   boost::unordered_map<int, EdgeSym> new_non_terminals,
                                   const set<int> group_set)
  {
    int curr_nt=0;
    vector<EdgeSym> terminal_symbols;
    bool finished = findNextNonTerminal (rule, group_set, 
                                         terminal_symbols, curr_nt);
    Rule new_r (g.getTermFactory ());
    for(unsigned i=0; i< terminal_symbols.size(); i++)
      new_r << terminal_symbols[i];
      
    if (finished)
    {
      // the rule has only terminal symbols
      new_r << new_non_terminals[lhs];
      g.prod(EdgeSym::mkVar(lhs), new_r);

      // LOG ("abstraction", 
      //      cout << "\t\trule only with terminal symbols: ";
      //      g.printProduction(cout, lhs); cout << endl);

      return;
    }
    else
    {
      // we found the first nonterminal symbol
      new_r << rule[curr_nt];
      g.prod(EdgeSym::mkVar(lhs), new_r);	

      // LOG ("abstraction" , 
      //      cout << "\t\tAdded rule from first nonterminal: ";
      //      g.printProduction(cout, lhs); cout << endl);

    }
    int prev_nt = curr_nt;
    curr_nt++;
    while (!finished)
    {
      terminal_symbols.clear();
      finished = findNextNonTerminal(rule, group_set, 
                                     terminal_symbols, curr_nt);
      Rule new_rr (g.getTermFactory ());
      for(unsigned i=0; i< terminal_symbols.size(); i++)
        new_rr << terminal_symbols[i];
      if (!finished)
      {
        // intermediate non terminal symbol
        new_rr << rule[curr_nt];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tintermediate nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        prev_nt = curr_nt;
        curr_nt++;
      }
      else
      {
        // last non terminal symbol
        new_rr << new_non_terminals[lhs];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tlast nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        break;
      }
    }
  }